

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O0

void __thiscall
boost::archive::json_iarchive_impl::load_override(json_iarchive_impl *this,object_reference_type *t)

{
  bool bVar1;
  Json *this_00;
  reference_type puVar2;
  size_t local_30;
  object_id_type local_28;
  object_reference_type local_24;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_20;
  Json *data;
  object_reference_type *t_local;
  json_iarchive_impl *this_local;
  
  data = (Json *)t;
  t_local = (object_reference_type *)this;
  this_00 = json_archive::get_data_abi_cxx11_(&(this->super_json_archive_interface).archive_);
  local_20 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,(key_type *)param::ObjectReferenceType_abi_cxx11_);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::is_number(local_20);
  if (bVar1) {
    optional<unsigned_int>::operator=(&(this->super_json_archive_interface).object_id_,local_20);
    (this->super_json_archive_interface).object_id_type_ = Reference;
    puVar2 = optional<unsigned_int>::operator*(&(this->super_json_archive_interface).class_id_);
    local_30 = (size_t)(int)*puVar2;
    object_id_type::object_id_type(&local_28,&local_30);
    object_reference_type::object_reference_type(&local_24,&local_28);
    object_reference_type::operator=((object_reference_type *)data,&local_24);
  }
  return;
}

Assistant:

void json_iarchive_impl::load_override(object_reference_type& t)
{
    Json& data = archive_.get_data()[param::ObjectReferenceType];
    if(!data.is_number())
    {
        return;
    }

    object_id_ = data;
    object_id_type_ = ObjectIDType::Reference;
    t = object_reference_type(object_id_type(int(*class_id_)));
}